

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

ON_SubDMeshFragmentGrid *
ON_SubDMeshFragmentGrid::QuadGridFromDisplayDensity
          (ON_SubDMeshFragmentGrid *__return_storage_ptr__,uint display_density,
          uint mesh_density_reduction)

{
  uchar *sides;
  ON_SubDMeshFragmentGrid *pOVar1;
  uint *puVar2;
  uint *puVar3;
  ushort uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  unsigned_short uVar9;
  unsigned_short uVar10;
  unsigned_short uVar11;
  ON__UINT16 OVar12;
  ON__UINT32 OVar13;
  undefined2 uVar14;
  undefined4 uVar15;
  undefined2 uVar16;
  ON_SubDMeshFragmentGrid *pOVar17;
  ON_SubDMeshFragmentGrid *pOVar18;
  uint uVar19;
  undefined2 uVar20;
  bool bVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  ON_SubDMeshFragmentGrid *pOVar25;
  long lVar26;
  ON_SubDMeshFragmentGrid *pOVar27;
  ulong uVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  int iVar33;
  ON_SubDMeshFragmentGrid *pOVar34;
  ulong uVar35;
  ON_SubDMeshFragmentGrid *quads;
  bool bVar36;
  ON_SubDMeshFragmentGrid *local_68;
  ON_MemoryAllocationTracking disable_tracking;
  
  if (display_density < 9) {
    pOVar1 = QuadGridFromDisplayDensity::grid_cache[display_density];
    if (QuadGridFromDisplayDensity::grid_cache[display_density] == (ON_SubDMeshFragmentGrid *)0x0) {
      bVar21 = ON_SleepLock::GetLock(&QuadGridFromDisplayDensity::lock,0x32,60000,true);
      pOVar1 = QuadGridFromDisplayDensity::grid_cache[display_density];
      if (pOVar1 == (ON_SubDMeshFragmentGrid *)0x0) {
        uVar28 = 0;
        ON_MemoryAllocationTracking::ON_MemoryAllocationTracking(&disable_tracking,false);
        uVar22 = 4;
        if (4 < display_density) {
          uVar22 = display_density;
        }
        uVar35 = (ulong)display_density;
        if (4 >= display_density) {
          uVar35 = uVar28;
        }
        uVar30 = (uint)uVar35;
        if (uVar22 < uVar30) {
          uVar35 = 0;
        }
        else {
          iVar33 = 0;
          iVar32 = 0;
          uVar31 = 0;
          do {
            uVar24 = 1 << ((byte)uVar35 & 0x1f);
            do {
              if (uVar24 < 0x41) {
                uVar19 = 1;
                do {
                  uVar23 = uVar19;
                  uVar19 = uVar23 * 2;
                } while (uVar23 < uVar24);
                bVar36 = true;
                if (uVar24 < uVar23) goto LAB_00612ff9;
              }
              else {
LAB_00612ff9:
                ON_SubDIncrementErrorCount();
                bVar36 = false;
              }
              iVar29 = uVar24 * uVar24;
              if (!bVar36) {
                iVar29 = 0;
              }
              iVar33 = iVar33 + iVar29;
              iVar32 = iVar32 + uVar24 * 4 + 1;
              uVar31 = uVar31 + 1;
              bVar36 = 1 < uVar24;
              uVar24 = uVar24 >> 1;
            } while (bVar36);
            uVar24 = (int)uVar35 + 1;
            uVar35 = (ulong)uVar24;
          } while (uVar24 <= uVar22);
          uVar35 = (ulong)(uint)(iVar32 + iVar33 * 4);
          uVar28 = (ulong)uVar31;
        }
        if ((uVar35 * -0x5555555555555554 >> 4 | uVar35 * -0x5555555555555554 << 0x3c) <
            0x555555555555556) {
          lVar26 = uVar35 * 4;
        }
        else {
          lVar26 = (uVar35 / 0xc) * 0x30 + 0x30;
        }
        pOVar27 = (ON_SubDMeshFragmentGrid *)
                  operator_new__(((lVar26 + uVar28 * 0x30) / 3 & 0xfffffffffffffff0) * 3,
                                 (nothrow_t *)&std::nothrow);
        pOVar18 = Empty.m_next_level_of_detail;
        pOVar17 = Empty.m_prev_level_of_detail;
        uVar16 = Empty.m_reserved5._2_2_;
        uVar15 = Empty._10_4_;
        uVar5 = Empty.m_reserved3;
        uVar14 = Empty._0_2_;
        pOVar25 = pOVar27 + uVar28;
        pOVar1 = (ON_SubDMeshFragmentGrid *)(&pOVar25->m_reserved1 + uVar35 * 4);
        for (; uVar30 <= uVar22; uVar30 = uVar30 + 1) {
          uVar24 = 1 << ((byte)uVar30 & 0x1f);
          local_68 = (ON_SubDMeshFragmentGrid *)0x0;
          uVar4 = 0;
          pOVar34 = pOVar27;
          quads = pOVar25;
          uVar31 = uVar24;
          do {
            if (uVar31 < 0x41) {
              uVar19 = 1;
              do {
                uVar23 = uVar19;
                uVar19 = uVar23 * 2;
              } while (uVar23 < uVar31);
              bVar36 = true;
              if (uVar31 < uVar23) goto LAB_0061314e;
            }
            else {
LAB_0061314e:
              ON_SubDIncrementErrorCount();
              bVar36 = false;
            }
            uVar19 = uVar31 * uVar31;
            if (!bVar36) {
              uVar19 = 0;
            }
            uVar28 = (ulong)(uVar31 * 4 + 1);
            sides = &quads->m_reserved1 + (ulong)(uVar19 * 4) * 4;
            pOVar25 = (ON_SubDMeshFragmentGrid *)(sides + uVar28 * 4);
            if (pOVar1 < pOVar25) {
              ON_SubDIncrementErrorCount();
            }
            else {
              SetQuads(uVar24,(uint)uVar4,(uint *)quads,(ulong)uVar19,4,(uint *)sides,uVar28,1);
              uVar20 = Empty._0_2_;
              Empty.m_reserved1 = (uchar)uVar14;
              Empty.m_reserved2 = SUB21(uVar14,1);
              uVar6 = Empty.m_reserved2;
              pOVar34->m_reserved1 = Empty.m_reserved1;
              Empty._0_2_ = uVar20;
              pOVar34->m_reserved2 = uVar6;
              pOVar34->m_side_segment_count = (uchar)uVar31;
              pOVar34->m_reserved3 = uVar5;
              pOVar34->m_F_count = (unsigned_short)uVar19;
              pOVar34->m_F_level_of_detail = uVar4;
              pOVar34->m_F_stride = 4;
              *(undefined4 *)&pOVar34->m_reserved4 = uVar15;
              *(undefined2 *)((long)&pOVar34->m_reserved5 + 2) = uVar16;
              pOVar34->m_F = (uint *)quads;
              pOVar34->m_S = (uint *)sides;
              pOVar34->m_prev_level_of_detail = pOVar17;
              pOVar34->m_next_level_of_detail = pOVar18;
              if (local_68 != (ON_SubDMeshFragmentGrid *)0x0) {
                pOVar34->m_prev_level_of_detail = local_68;
                local_68->m_next_level_of_detail = pOVar34;
              }
              uVar4 = uVar4 + 1;
              local_68 = pOVar34;
            }
            if (pOVar1 < pOVar25) break;
            pOVar34 = pOVar34 + 1;
            bVar36 = 1 < uVar31;
            quads = pOVar25;
            uVar31 = uVar31 >> 1;
          } while (bVar36);
          QuadGridFromDisplayDensity::grid_cache[uVar30] = pOVar27;
          pOVar27 = pOVar34;
        }
        if (bVar21) {
          ON_SleepLock::ReturnLock(&QuadGridFromDisplayDensity::lock);
        }
        if (pOVar25 != pOVar1) {
          ON_SubDIncrementErrorCount();
        }
        pOVar1 = QuadGridFromDisplayDensity::grid_cache[display_density];
        if (QuadGridFromDisplayDensity::grid_cache[display_density] ==
            (ON_SubDMeshFragmentGrid *)0x0) {
          ON_SubDIncrementErrorCount();
          pOVar25 = &Empty;
        }
        else {
          do {
            pOVar25 = pOVar1;
            if (mesh_density_reduction <= pOVar25->m_F_level_of_detail) break;
            pOVar1 = pOVar25->m_next_level_of_detail;
          } while (pOVar25->m_next_level_of_detail != (ON_SubDMeshFragmentGrid *)0x0);
        }
        uVar5 = pOVar25->m_reserved1;
        uVar6 = pOVar25->m_reserved2;
        uVar7 = pOVar25->m_side_segment_count;
        uVar8 = pOVar25->m_reserved3;
        uVar9 = pOVar25->m_F_count;
        uVar10 = pOVar25->m_F_level_of_detail;
        uVar11 = pOVar25->m_F_stride;
        OVar12 = pOVar25->m_reserved4;
        OVar13 = pOVar25->m_reserved5;
        puVar2 = pOVar25->m_F;
        puVar3 = pOVar25->m_S;
        pOVar1 = pOVar25->m_next_level_of_detail;
        __return_storage_ptr__->m_prev_level_of_detail = pOVar25->m_prev_level_of_detail;
        __return_storage_ptr__->m_next_level_of_detail = pOVar1;
        __return_storage_ptr__->m_F = puVar2;
        __return_storage_ptr__->m_S = puVar3;
        __return_storage_ptr__->m_reserved1 = uVar5;
        __return_storage_ptr__->m_reserved2 = uVar6;
        __return_storage_ptr__->m_side_segment_count = uVar7;
        __return_storage_ptr__->m_reserved3 = uVar8;
        __return_storage_ptr__->m_F_count = uVar9;
        __return_storage_ptr__->m_F_level_of_detail = uVar10;
        __return_storage_ptr__->m_F_stride = uVar11;
        __return_storage_ptr__->m_reserved4 = OVar12;
        __return_storage_ptr__->m_reserved5 = OVar13;
        ON_MemoryAllocationTracking::~ON_MemoryAllocationTracking(&disable_tracking);
        return __return_storage_ptr__;
      }
      ON_SleepLock::ReturnLock(&QuadGridFromDisplayDensity::lock);
      do {
        pOVar25 = pOVar1;
        if (mesh_density_reduction <= pOVar25->m_F_level_of_detail) break;
        pOVar1 = pOVar25->m_next_level_of_detail;
      } while (pOVar25->m_next_level_of_detail != (ON_SubDMeshFragmentGrid *)0x0);
    }
    else {
      do {
        pOVar25 = pOVar1;
        if (mesh_density_reduction <= pOVar25->m_F_level_of_detail) break;
        pOVar1 = pOVar25->m_next_level_of_detail;
      } while (pOVar25->m_next_level_of_detail != (ON_SubDMeshFragmentGrid *)0x0);
    }
  }
  else {
    ON_SubDIncrementErrorCount();
    pOVar25 = &Empty;
  }
  uVar5 = pOVar25->m_reserved1;
  uVar6 = pOVar25->m_reserved2;
  uVar7 = pOVar25->m_side_segment_count;
  uVar8 = pOVar25->m_reserved3;
  uVar9 = pOVar25->m_F_count;
  uVar10 = pOVar25->m_F_level_of_detail;
  uVar11 = pOVar25->m_F_stride;
  OVar12 = pOVar25->m_reserved4;
  OVar13 = pOVar25->m_reserved5;
  puVar2 = pOVar25->m_F;
  puVar3 = pOVar25->m_S;
  pOVar1 = pOVar25->m_next_level_of_detail;
  __return_storage_ptr__->m_prev_level_of_detail = pOVar25->m_prev_level_of_detail;
  __return_storage_ptr__->m_next_level_of_detail = pOVar1;
  __return_storage_ptr__->m_F = puVar2;
  __return_storage_ptr__->m_S = puVar3;
  __return_storage_ptr__->m_reserved1 = uVar5;
  __return_storage_ptr__->m_reserved2 = uVar6;
  __return_storage_ptr__->m_side_segment_count = uVar7;
  __return_storage_ptr__->m_reserved3 = uVar8;
  __return_storage_ptr__->m_F_count = uVar9;
  __return_storage_ptr__->m_F_level_of_detail = uVar10;
  __return_storage_ptr__->m_F_stride = uVar11;
  __return_storage_ptr__->m_reserved4 = OVar12;
  __return_storage_ptr__->m_reserved5 = OVar13;
  return __return_storage_ptr__;
}

Assistant:

ON_SubDMeshFragmentGrid ON_SubDMeshFragmentGrid::QuadGridFromDisplayDensity(
  unsigned int display_density,
  unsigned int mesh_density_reduction
  )
{
  static const ON_SubDMeshFragmentGrid* grid_cache[9] = { 0 }; // side_segment_count = 1,2,4,8,16,32,64,128,256

  if ( ((size_t)display_density) >= sizeof(grid_cache)/sizeof(grid_cache[0]))
    return ON_SUBD_RETURN_ERROR(ON_SubDMeshFragmentGrid::Empty);

  const ON_SubDMeshFragmentGrid* fragment_grid = grid_cache[display_density];
  if (nullptr != fragment_grid)
  {
    while ( fragment_grid->m_F_level_of_detail < mesh_density_reduction && nullptr != fragment_grid->m_next_level_of_detail)
      fragment_grid = fragment_grid->m_next_level_of_detail;
    return *fragment_grid;
  }

  // The code below is thread safe and constructs the ON_SubDLimitMeshFragmentGrids
  // that are resources shared by all ON_SubDLimitMeshFragments.

  static ON_SleepLock lock;
  const bool bReturnLock = lock.GetLock(50,ON_SleepLock::OneMinute,true);

  // try again in case cache was made while waiting
  fragment_grid = grid_cache[display_density];
  if (nullptr != fragment_grid)
  {
    lock.ReturnLock();
    while ( fragment_grid->m_F_level_of_detail < mesh_density_reduction && nullptr != fragment_grid->m_next_level_of_detail)
      fragment_grid = fragment_grid->m_next_level_of_detail;
    return *fragment_grid;
  }

  // The ON_SubDMeshFragmentGrid classes created below are created one time as needed
  // and used millions of times after that. These are app workspace allocations
  // and not memory leaks. Once a grid exists, it is saved in grid_cache[] and returned
  // above the next zillion times it is required.
  ON_MemoryAllocationTracking disable_tracking(false);

  // make the requested grid
  unsigned int quad_capacity = 0;
  unsigned int side_segment_capacity = 0;
  unsigned int grid_count = 0;
  unsigned int grid_cache_index0 = display_density;
  unsigned int grid_cache_index1 = display_density;
  if (display_density <= ON_SubDDisplayParameters::DefaultDensity)
  {
    // make all the common small grids
    grid_cache_index0 = 0;
    grid_cache_index1 = ON_SubDDisplayParameters::DefaultDensity;
  }
  for (unsigned int i = grid_cache_index0; i <= grid_cache_index1; i++)
  {
    // allocate all levels of detail for each segment side count
    unsigned int s1 = (1U << i);
    for (unsigned int s2 = s1; s2 > 0; s2 /= 2)
    {
      quad_capacity += ON_SubDMeshFragment::QuadGridQuadCountFromSideCount(s2);
      side_segment_capacity += 4*s2 + 1;
      grid_count++;
    }
  }


  const unsigned int vdex_capacity = (quad_capacity*4 + side_segment_capacity);
  size_t sz1 = grid_count*sizeof(ON_SubDMeshFragmentGrid);
  size_t sz2 = vdex_capacity*sizeof(unsigned int);
  if (0 != sz2 % sizeof(ON_SubDMeshFragmentGrid))
    sz2 = (1 + sz2/sizeof(ON_SubDMeshFragmentGrid))*sizeof(ON_SubDMeshFragmentGrid);
  ON_SubDMeshFragmentGrid* grids = new (std::nothrow) ON_SubDMeshFragmentGrid[(sz1 + sz2)/sizeof(ON_SubDMeshFragmentGrid)];

  ON_SubDMeshFragmentGrid grid = ON_SubDMeshFragmentGrid::Empty;
  grid.m_F_stride = 4;
  unsigned int* vdex0 = (unsigned int*)(grids + grid_count);
  unsigned int* vdex1 = vdex0 + vdex_capacity;
  unsigned int* vdex = vdex0;

  for (unsigned int i = grid_cache_index0; i <= grid_cache_index1; i++)
  {
    const unsigned int s1 = (1U << i);
    ON_SubDMeshFragmentGrid* first_lod = grids;
    ON_SubDMeshFragmentGrid* prev_lod = nullptr;
    grid.m_F_level_of_detail = 0;
    for (unsigned int s2 = s1; s2 > 0; s2 /= 2, grids++)
    {
      const unsigned int grid_F_capacity = ON_SubDMeshFragment::QuadGridQuadCountFromSideCount(s2);
      const unsigned int grid_S_capacity = 4*s2 + 1;

      grid.m_side_segment_count = (unsigned char)s2;
      grid.m_F_count = (unsigned short)grid_F_capacity;
      grid.m_F = vdex;
      vdex += 4*grid_F_capacity;
      grid.m_S = vdex;
      vdex += grid_S_capacity;

      if (vdex > vdex1)
      {
        ON_SubDIncrementErrorCount();
        break;
      }

      ON_SubDMeshFragmentGrid::SetQuads(
        s1, // top level side_segment_count
        grid.m_F_level_of_detail,
        const_cast<unsigned int*>(grid.m_F),
        grid_F_capacity,
        grid.m_F_stride,
        const_cast<unsigned int*>(grid.m_S),
        grid_S_capacity,
        1U
        );

      *grids = grid;
      if ( nullptr != prev_lod )
      {
        grids->m_prev_level_of_detail = prev_lod;
        prev_lod->m_next_level_of_detail = grids;
      }
      prev_lod = grids;

      grid.m_F += (grid.m_F_count*grid.m_F_stride);
      grid.m_F_level_of_detail++;
    }

    // Do not initialize grid_cache[i] until entire linked list is ready to be used.
    // This way if the lock is stolen for some unforeseen reason, we risk leaking memory
    // but we will not crash.
    grid_cache[i] = first_lod;
  }

  if ( bReturnLock )
    lock.ReturnLock();

  if (vdex != vdex1)
  {
    ON_SubDIncrementErrorCount();
  }

  fragment_grid = grid_cache[display_density];
  if (nullptr != fragment_grid)
  {
    while ( fragment_grid->m_F_level_of_detail < mesh_density_reduction && nullptr != fragment_grid->m_next_level_of_detail)
      fragment_grid = fragment_grid->m_next_level_of_detail;
    return *fragment_grid;
  }

  return ON_SUBD_RETURN_ERROR(ON_SubDMeshFragmentGrid::Empty);
}